

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O1

void __thiscall
chrono::ChLoadBodyBodyBushingPlastic::ComputeBodyBodyForceTorque
          (ChLoadBodyBodyBushingPlastic *this,ChFrameMoving<double> *rel_AB,
          ChVector<double> *loc_force,ChVector<double> *loc_torque)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  dVar1 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[2];
  dVar2 = (this->plastic_def).m_data[2];
  dVar3 = (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[2];
  dVar4 = (rel_AB->coord_dt).pos.m_data[2];
  dVar5 = (this->super_ChLoadBodyBodyBushingSpherical).damping.m_data[2];
  dVar6 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[1];
  dVar7 = (this->plastic_def).m_data[1];
  dVar8 = (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[1];
  dVar9 = (rel_AB->coord_dt).pos.m_data[1];
  dVar10 = (this->super_ChLoadBodyBodyBushingSpherical).damping.m_data[1];
  dVar11 = ((rel_AB->super_ChFrame<double>).coord.pos.m_data[0] - (this->plastic_def).m_data[0]) *
           (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[0] +
           (rel_AB->coord_dt).pos.m_data[0] *
           (this->super_ChLoadBodyBodyBushingSpherical).damping.m_data[0];
  loc_force->m_data[0] = dVar11;
  loc_force->m_data[1] = (dVar6 - dVar7) * dVar8 + dVar9 * dVar10;
  loc_force->m_data[2] = (dVar1 - dVar2) * dVar3 + dVar4 * dVar5;
  dVar1 = (this->yield).m_data[0];
  if (dVar1 < dVar11) {
    loc_force->m_data[0] = dVar1;
    (this->plastic_def).m_data[0] =
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[0] -
         dVar1 / (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[0];
  }
  dVar1 = (this->yield).m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  auVar14 = vxorpd_avx512vl(auVar15,auVar14);
  if (loc_force->m_data[0] < auVar14._0_8_) {
    loc_force->m_data[0] = auVar14._0_8_;
    (this->plastic_def).m_data[0] =
         dVar1 / (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[0] +
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[0];
  }
  dVar1 = (this->yield).m_data[1];
  if (dVar1 < loc_force->m_data[1]) {
    loc_force->m_data[1] = dVar1;
    (this->plastic_def).m_data[1] =
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[1] -
         dVar1 / (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[1];
  }
  dVar1 = (this->yield).m_data[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar14 = vxorpd_avx512vl(auVar16,auVar12);
  if (loc_force->m_data[1] < auVar14._0_8_) {
    loc_force->m_data[1] = auVar14._0_8_;
    (this->plastic_def).m_data[1] =
         dVar1 / (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[1] +
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[1];
  }
  dVar1 = (this->yield).m_data[2];
  if (dVar1 < loc_force->m_data[2]) {
    loc_force->m_data[2] = dVar1;
    (this->plastic_def).m_data[2] =
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[2] -
         dVar1 / (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[2];
  }
  dVar1 = (this->yield).m_data[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  auVar13._8_8_ = 0x8000000000000000;
  auVar13._0_8_ = 0x8000000000000000;
  auVar14 = vxorpd_avx512vl(auVar17,auVar13);
  if (loc_force->m_data[2] < auVar14._0_8_) {
    loc_force->m_data[2] = auVar14._0_8_;
    (this->plastic_def).m_data[2] =
         dVar1 / (this->super_ChLoadBodyBodyBushingSpherical).stiffness.m_data[2] +
         (rel_AB->super_ChFrame<double>).coord.pos.m_data[2];
  }
  if (loc_torque != (ChVector<double> *)&VNULL) {
    loc_torque->m_data[0] = VNULL;
    loc_torque->m_data[1] = DAT_00b90ac0;
    loc_torque->m_data[2] = DAT_00b90ac8;
  }
  return;
}

Assistant:

inline ChVector<Real> ChVector<Real>::operator-(const ChVector<Real>& other) const {
    ChVector<Real> v;

    v.m_data[0] = m_data[0] - other.m_data[0];
    v.m_data[1] = m_data[1] - other.m_data[1];
    v.m_data[2] = m_data[2] - other.m_data[2];

    return v;
}